

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O1

void soplex::
     LPFwriteSVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *p_lp,ostream *p_output,NameSet *p_cnames,
               SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *p_svec,bool writeZeroCoefficients)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  ostream *poVar3;
  int i;
  cpp_dec_float<50U,_int,_void> *this;
  _Ios_Iostate _Var4;
  int iVar5;
  bool bVar6;
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  coeff;
  char name [16];
  bool local_d4;
  cpp_dec_float<50U,_int,_void> local_b8;
  cpp_dec_float<50U,_int,_void> local_80;
  char local_48 [24];
  
  if (0 < (p_lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    local_d4 = !writeZeroCoefficients;
    i = 0;
    iVar5 = 0;
    do {
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_80,p_svec,i);
      if (local_80.fpclass == cpp_dec_float_NaN) {
        bVar6 = false;
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_b8,0,(type *)0x0);
        iVar1 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_80,&local_b8);
        bVar6 = iVar1 == 0;
      }
      if (!(bool)(local_d4 & bVar6)) {
        if (iVar5 == 0) {
          poVar3 = boost::multiprecision::operator<<
                             (p_output,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&local_80);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
          __s = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (p_lp,i,p_cnames,local_48);
          if (__s != (char *)0x0) {
            sVar2 = strlen(__s);
            goto LAB_0017a892;
          }
          _Var4 = (int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18);
LAB_0017a8c1:
          std::ios::clear(_Var4);
        }
        else {
          this = &local_80;
          if (iVar5 * -0x33333333 + 0x19999999U < 0x33333333) {
            std::__ostream_insert<char,std::char_traits<char>>(p_output,"\n\t",2);
          }
          if (local_80.fpclass == cpp_dec_float_NaN) {
LAB_0017a7db:
            std::__ostream_insert<char,std::char_traits<char>>(p_output," + ",3);
          }
          else {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                      (&local_b8,0,(type *)0x0);
            iVar1 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (this,&local_b8);
            if (-1 < iVar1) goto LAB_0017a7db;
            std::__ostream_insert<char,std::char_traits<char>>(p_output," - ",3);
            local_b8.neg = local_80.neg;
            local_b8.data._M_elems[0] = local_80.data._M_elems[0];
            if (local_80.fpclass != cpp_dec_float_finite || local_b8.data._M_elems[0] != 0) {
              local_b8.neg = (bool)(local_80.neg ^ 1);
            }
            this = &local_b8;
          }
          boost::multiprecision::operator<<
                    (p_output,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)this);
          std::__ostream_insert<char,std::char_traits<char>>(p_output," ",1);
          __s = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (p_lp,i,p_cnames,local_48);
          if (__s == (char *)0x0) {
            _Var4 = (int)p_output + (int)*(undefined8 *)(*(long *)p_output + -0x18);
            goto LAB_0017a8c1;
          }
          sVar2 = strlen(__s);
          poVar3 = p_output;
LAB_0017a892:
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar2);
        }
        iVar5 = iVar5 + 1;
      }
      i = i + 1;
    } while (i < (p_lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum);
  }
  return;
}

Assistant:

static void LPFwriteSVector(
   const SPxLPBase<R>&   p_lp,                         ///< the LP
   std::ostream&         p_output,                     ///< output stream
   const NameSet*        p_cnames,                     ///< column names
   const SVectorBase<R>& p_svec,                       ///< vector to write
   const bool            writeZeroCoefficients = false ///< write zero objective coefficients
)
{

   char name[16];
   int num_coeffs = 0;

   for(int j = 0; j < p_lp.nCols(); ++j)
   {
      const R coeff = p_svec[j];

      if(coeff == 0 && !writeZeroCoefficients)
         continue;

      if(num_coeffs == 0)
         p_output << coeff << " " << getColName(p_lp, j, p_cnames, name);
      else
      {
         // insert a line break every SOPLEX_NUM_ENTRIES_PER_LINE columns
         if(num_coeffs % SOPLEX_NUM_ENTRIES_PER_LINE == 0)
            p_output << "\n\t";

         if(coeff < 0)
            p_output << " - " << -coeff;
         else
            p_output << " + " << coeff;

         p_output << " " << getColName(p_lp, j, p_cnames, name);
      }

      ++num_coeffs;
   }
}